

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::IGXMLScanner::scanNext(IGXMLScanner *this,XMLPScanToken *token)

{
  ReaderMgr *this_00;
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  XMLTokens XVar3;
  StackElem *pSVar4;
  XMLCh *text1;
  RuntimeException *this_01;
  bool gotData;
  ReaderMgrResetType resetReaderMgr;
  XMLSize_t orgReader;
  
  bVar2 = XMLScanner::isLegalToken(&this->super_XMLScanner,token);
  if (!bVar2) {
    this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0x137,Scan_BadPScanToken,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(this_01,&RuntimeException::typeinfo,XMLException::~XMLException);
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  resetReaderMgr.fToCall = (MFPT)ReaderMgr::reset;
  resetReaderMgr._16_8_ = 0;
  resetReaderMgr.fObject = this_00;
  XVar3 = XMLScanner::senseNextToken(&this->super_XMLScanner,&orgReader);
  if (XVar3 == Token_CharData) {
    (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xc])
              (this,&(this->super_XMLScanner).fCDataBuf);
  }
  else {
    if (XVar3 == Token_EOF) {
      if ((this->super_XMLScanner).fElemStack.fStackTop == 0) {
        bVar2 = false;
      }
      else {
        pSVar4 = ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
        text1 = XMLElementDecl::getFullName(pSVar4->fThisElement);
        bVar2 = false;
        XMLScanner::emitError
                  (&this->super_XMLScanner,EndedWithTagsOnStack,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      goto LAB_002a5c7a;
    }
    gotData = true;
    switch(XVar3) {
    case Token_CData:
      if ((this->super_XMLScanner).fElemStack.fStackTop == 0) {
        XMLScanner::emitError(&this->super_XMLScanner,CDATAOutsideOfContent);
      }
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xb])(this);
      break;
    default:
      ReaderMgr::skipToChar(this_00,L'<');
      break;
    case Token_Comment:
      XMLScanner::scanComment(&this->super_XMLScanner);
      break;
    case Token_EndTag:
      scanEndTag(this,&gotData);
      break;
    case Token_PI:
      XMLScanner::scanPI(&this->super_XMLScanner);
      break;
    case Token_StartTag:
      if ((this->super_XMLScanner).fDoNamespaces == true) {
        scanStartTagNS(this,&gotData);
      }
      else {
        scanStartTag(this,&gotData);
      }
    }
    if (orgReader != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
      XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
    }
    if (gotData == false) {
      if ((this->super_XMLScanner).fValidate == true) {
        XMLScanner::checkIDRefs(&this->super_XMLScanner);
      }
      XMLScanner::scanMiscellaneous(&this->super_XMLScanner);
      pXVar1 = (this->super_XMLScanner).fDocHandler;
      if (pXVar1 != (XMLDocumentHandler *)0x0) {
        (*pXVar1->_vptr_XMLDocumentHandler[5])();
      }
    }
  }
  resetReaderMgr.fObject = (ReaderMgr *)0x0;
  bVar2 = true;
LAB_002a5c7a:
  JanitorMemFunCall<xercesc_4_0::ReaderMgr>::~JanitorMemFunCall(&resetReaderMgr);
  return bVar2;
}

Assistant:

bool IGXMLScanner::scanNext(XMLPScanToken& token)
{
    // Make sure this token is still legal
    if (!isLegalToken(token))
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_BadPScanToken, fMemoryManager);

    // Find the next token and remember the reader id
    XMLSize_t orgReader;
    XMLTokens curToken;

    ReaderMgrResetType  resetReaderMgr(&fReaderMgr, &ReaderMgr::reset);

    bool retVal = true;

    try
    {
        while (true)
        {
            //  We have to handle any end of entity exceptions that happen here.
            //  We could be at the end of X nested entities, each of which will
            //  generate an end of entity exception as we try to move forward.
            try
            {
                curToken = senseNextToken(orgReader);
                break;
            }
            catch(const EndOfEntityException& toCatch)
            {
                // Send an end of entity reference event
                if (fDocHandler)
                    fDocHandler->endEntityReference(toCatch.getEntity());
            }
        }

        if (curToken == Token_CharData)
        {
            scanCharData(fCDataBuf);
        }
        else if (curToken == Token_EOF)
        {
            if (!fElemStack.isEmpty())
            {
                const ElemStack::StackElem* topElem = fElemStack.popTop();
                emitError
                (
                    XMLErrs::EndedWithTagsOnStack
                    , topElem->fThisElement->getFullName()
                );
            }

            retVal = false;
        }
        else
        {
            // Its some sort of markup
            bool gotData = true;
            switch(curToken)
            {
                case Token_CData :
                    // Make sure we are within content
                    if (fElemStack.isEmpty())
                        emitError(XMLErrs::CDATAOutsideOfContent);
                    scanCDSection();
                    break;

                case Token_Comment :
                    scanComment();
                    break;

                case Token_EndTag :
                    scanEndTag(gotData);
                    break;

                case Token_PI :
                    scanPI();
                    break;

                case Token_StartTag :
                    if (fDoNamespaces)
                        scanStartTagNS(gotData);
                    else
                        scanStartTag(gotData);
                    break;

                default :
                    fReaderMgr.skipToChar(chOpenAngle);
                    break;
            }

            if (orgReader != fReaderMgr.getCurrentReaderNum())
                emitError(XMLErrs::PartialMarkupInEntity);

            // If we hit the end, then do the miscellaneous part
            if (!gotData)
            {
                // Do post-parse validation if required
                if (fValidate)
                {
                    //  We handle ID reference semantics at this level since
                    //  its required by XML 1.0.
                    checkIDRefs();

                    // Then allow the validator to do any extra stuff it wants
//                    fValidator->postParseValidation();
                }

                // That went ok, so scan for any miscellaneous stuff
                scanMiscellaneous();

                if (toCheckIdentityConstraint())
                    fICHandler->endDocument();

                if (fDocHandler)
                    fDocHandler->endDocument();
            }
        }
    }
    //  NOTE:
    //
    //  In all of the error processing below, the emitError() call MUST come
    //  before the flush of the reader mgr, or it will fail because it tries
    //  to find out the position in the XML source of the error.
    catch(const XMLErrs::Codes)
    {
        // This is a 'first failure' exception so return failure
        retVal = false;
    }
    catch(const XMLValid::Codes)
    {
        // This is a 'first fatal error' type exit, so return failure
        retVal = false;
    }
    catch(const XMLException& excToCatch)
    {
        //  Emit the error and catch any user exception thrown from here. Make
        //  sure in all cases we flush the reader manager.
        fInException = true;
        try
        {
            if (excToCatch.getErrorType() == XMLErrorReporter::ErrType_Warning)
                emitError
                (
                    XMLErrs::XMLException_Warning
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else if (excToCatch.getErrorType() >= XMLErrorReporter::ErrType_Fatal)
                emitError
                (
                    XMLErrs::XMLException_Fatal
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else
                emitError
                (
                    XMLErrs::XMLException_Error
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
        }
        catch(const OutOfMemoryException&)
        {
            // This is a special case for out-of-memory
            // conditions, because resetting the ReaderMgr
            // can be problematic.
            resetReaderMgr.release();

            throw;
        }

        retVal = false;
    }
    catch(const OutOfMemoryException&)
    {
        // This is a special case for out-of-memory
        // conditions, because resetting the ReaderMgr
        // can be problematic.
        resetReaderMgr.release();

        throw;
    }

    // If we are not at the end, release the object that will
    // reset the ReaderMgr.
    if (retVal)
        resetReaderMgr.release();

    return retVal;
}